

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

void __thiscall RString::ToLowerCase(RString *this)

{
  byte bVar1;
  int i;
  long lVar2;
  
  PrepForMod(this);
  lVar2 = 0;
  while( true ) {
    bVar1 = this->myString[lVar2];
    if (bVar1 == 0) break;
    if ((byte)(bVar1 + 0xbf) < 0x1a) {
      this->myString[lVar2] = bVar1 | 0x20;
    }
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void RString::ToLowerCase(void)
{
	PrepForMod();

	for(int i = 0; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'A' && *(myString + i) <= 'Z')
			*(myString + i) += 'a' - 'A';
}